

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrase_test.cpp
# Opt level: O0

void __thiscall
jhu::thrax::PhraseTests_SmallConsistent_Test::~PhraseTests_SmallConsistent_Test
          (PhraseTests_SmallConsistent_Test *this)

{
  PhraseTests_SmallConsistent_Test *this_local;
  
  ~PhraseTests_SmallConsistent_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(PhraseTests, SmallConsistent) {
  auto a = readAlignment("0-0 1-1");
  SpanPair sp1{{0, 1}, {0, 1}};
  SpanPair sp2{{1, 2}, {1, 2}};
  SpanPair sp3{{0, 2}, {0, 2}};
  EXPECT_TRUE(isConsistent(a, sp1));
  EXPECT_TRUE(isConsistent(a, sp2));
  EXPECT_TRUE(isConsistent(a, sp3));
}